

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

ON_wString * __thiscall ON_UnitSystem::UnitSystemName(ON_UnitSystem *this)

{
  bool bVar1;
  int iVar2;
  ON_UnitSystem *this_local;
  
  switch(this->m_unit_system) {
  case None:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"no units",&UnitSystemName::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName::s_name;
    break;
  case Microns:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"microns",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Millimeters:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"millimeters",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Centimeters:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"centimeters",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Meters:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"meters",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Kilometers:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"kilometers",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Microinches:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"microinches",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Mils:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"mils",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Inches:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"inches",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Feet:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"feet",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Miles:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"miles",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case CustomUnits:
    bVar1 = ON_wString::IsEmpty(&this->m_custom_unit_name);
    if (bVar1) {
      if ((UnitSystemName()::s_name == '\0') &&
         (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
        ON_wString::ON_wString(&UnitSystemName()::s_name);
        __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
        __cxa_guard_release(&UnitSystemName()::s_name);
      }
      ON_Internal_InitUnitSystemName(L"custom units",&UnitSystemName()::s_name);
      this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    }
    else {
      this_local = (ON_UnitSystem *)&this->m_custom_unit_name;
    }
    break;
  case Angstroms:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"angstroms",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Nanometers:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"nanometers",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Decimeters:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"decimeters",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Dekameters:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"dekameters",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Hectometers:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"hectometers",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Megameters:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"megameters",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Gigameters:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"gigameters",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Yards:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"yards",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case PrinterPoints:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"points",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case PrinterPicas:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"picas",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case NauticalMiles:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"nautical miles",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case AstronomicalUnits:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"astronomical units",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case LightYears:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"light years",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Parsecs:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"parsecs",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  case Unset:
    if ((UnitSystemName()::s_name == '\0') &&
       (iVar2 = __cxa_guard_acquire(&UnitSystemName()::s_name), iVar2 != 0)) {
      ON_wString::ON_wString(&UnitSystemName()::s_name);
      __cxa_atexit(ON_wString::~ON_wString,&UnitSystemName()::s_name,&__dso_handle);
      __cxa_guard_release(&UnitSystemName()::s_name);
    }
    ON_Internal_InitUnitSystemName(L"unset",&UnitSystemName()::s_name);
    this_local = (ON_UnitSystem *)&UnitSystemName()::s_name;
    break;
  default:
    this_local = (ON_UnitSystem *)&ON_wString::EmptyString;
  }
  return (ON_wString *)this_local;
}

Assistant:

const ON_wString& ON_UnitSystem::UnitSystemName() const
{
  switch (m_unit_system)
  {
  case ON::LengthUnitSystem::None:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"no units",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Angstroms:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"angstroms",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Nanometers:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"nanometers",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Microns:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"microns",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Millimeters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"millimeters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Decimeters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"decimeters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Centimeters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"centimeters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Meters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"meters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Dekameters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"dekameters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Hectometers:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"hectometers",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Kilometers:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"kilometers",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Megameters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"megameters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Gigameters:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"gigameters",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Microinches:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"microinches",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Mils:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"mils",s_name);// (= 0.001 inches)";
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Inches:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"inches",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Feet:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"feet",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Yards:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"yards",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Miles:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"miles",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::PrinterPoints:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"points",s_name); // (1/72 inch)";
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::PrinterPicas:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"picas",s_name); // (1/6 inch)";
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::NauticalMiles:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"nautical miles",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::AstronomicalUnits:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"astronomical units",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::LightYears:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"light years",s_name);
      return s_name;
    }
    break;
  case ON::LengthUnitSystem::Parsecs:
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"parsecs",s_name);
      return s_name;
    }
    break;

  case ON::LengthUnitSystem::CustomUnits:
    if (m_custom_unit_name.IsEmpty())
    {
      static ON_wString s_name;
      ON_Internal_InitUnitSystemName(L"custom units", s_name);
      return s_name;
    }
    return m_custom_unit_name;
    break;

  case ON::LengthUnitSystem::Unset:
    {
    static ON_wString s_name;
    ON_Internal_InitUnitSystemName(L"unset", s_name);
    return s_name;
    }
    break;
  }

  return ON_wString::EmptyString;
}